

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFloatStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_2::SampleCoverageCase::test(SampleCoverageCase *this)

{
  CallLogWrapper *this_00;
  GLfloat GVar1;
  int iVar2;
  int ndx;
  ulong uVar3;
  long lVar4;
  GLfloat *pGVar5;
  bool bVar6;
  GLfloat GVar7;
  float fVar8;
  Random rnd;
  
  deRandom_init(&rnd.m_rnd,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[2])
            (0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
  ApiCase::expectError(&this->super_ApiCase,0);
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 4) {
    GVar1 = *(GLfloat *)((long)&DAT_009dea80 + lVar4);
    glu::CallLogWrapper::glSampleCoverage(this_00,GVar1,'\0');
    (*this->m_verifier->_vptr_StateVerifier[2])
              (GVar1,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  pGVar5 = (GLfloat *)&DAT_009dea90;
  for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
    GVar1 = *pGVar5;
    glu::CallLogWrapper::glSampleCoverage(this_00,GVar1,'\0');
    GVar7 = 0.0;
    if (1 < uVar3) {
      GVar7 = 1.0;
      if (GVar1 <= 1.0) {
        GVar7 = GVar1;
      }
    }
    (*this->m_verifier->_vptr_StateVerifier[2])
              (GVar7,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
    pGVar5 = pGVar5 + 1;
  }
  iVar2 = 0x78;
  while (bVar6 = iVar2 != 0, iVar2 = iVar2 + -1, bVar6) {
    fVar8 = deRandom_getFloat(&rnd.m_rnd);
    bVar6 = de::Random::getBool((Random *)&rnd.m_rnd);
    glu::CallLogWrapper::glSampleCoverage(this_00,fVar8 + 0.0,bVar6);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (fVar8 + 0.0,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80aa);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, 1.0f);
		expectError(GL_NO_ERROR);

		{
			const float fixedTests[] =
			{
				0.0f, 0.5f, 0.45f, 0.55f
			};
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
			{
				glSampleCoverage(fixedTests[ndx], GL_FALSE);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, fixedTests[ndx]);
				expectError(GL_NO_ERROR);
			}
		}

		{
			const float clampTests[] =
			{
				-1.0f, -1.5f, 1.45f, 3.55f
			};
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(clampTests); ++ndx)
			{
				glSampleCoverage(clampTests[ndx], GL_FALSE);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, de::clamp(clampTests[ndx], 0.0f, 1.0f));
				expectError(GL_NO_ERROR);
			}
		}

		{
			const int numIterations = 120;
			for (int i = 0; i < numIterations; ++i)
			{
				GLfloat		reference	= rnd.getFloat(0, 1);
				GLboolean	invert		= rnd.getBool() ? GL_TRUE : GL_FALSE;

				glSampleCoverage(reference, invert);
				m_verifier->verifyFloat(m_testCtx, GL_SAMPLE_COVERAGE_VALUE, reference);
				expectError(GL_NO_ERROR);
			}
		}
	}